

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O0

void __thiscall VcprojGenerator::initDeploymentTool(VcprojGenerator *this)

{
  QLatin1StringView s;
  QLatin1StringView s_00;
  initializer_list<QString> args;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  bool bVar1;
  byte bVar2;
  bool bVar3;
  QFlags<QDirListing::IteratorFlag> QVar4;
  const_iterator o;
  ulong uVar5;
  qsizetype qVar6;
  qsizetype qVar7;
  long in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<QString_&,_QLatin1Char> QVar8;
  int diffSize;
  value_type *dirEntry;
  QDirListing *__range3_1;
  int pathSize;
  ProString *src;
  ProStringList *__range2;
  ProString *item;
  ProStringList *__range1;
  ProString *dllPath_1;
  ProStringList *__range5;
  bool foundGuid;
  ProString *dllPath;
  ProStringList *__range3;
  bool qpaPluginDeployed;
  VCConfiguration *conf;
  QString absoluteItemPath;
  sentinel __end3_1;
  const_iterator __begin3_1;
  QDirListing dirList;
  QString searchPath;
  QFileInfo info_1;
  QString nameFilter;
  QString source;
  QString itemDevicePath;
  iterator __end2;
  iterator __begin2;
  QString devicePath;
  iterator __end1;
  iterator __begin1;
  QString absoluteDllFilePath_1;
  const_iterator __end5;
  const_iterator __begin5;
  QFileInfo info2;
  QString debugInfix;
  QString absoluteDllFilePath;
  const_iterator __end3;
  const_iterator __begin3;
  QFileInfo info;
  QString dllName;
  ConstIterator it;
  ProStringList arg;
  ProStringList dllPaths;
  QString targetPath;
  undefined4 in_stack_fffffffffffff118;
  CaseSensitivity in_stack_fffffffffffff11c;
  QMakeProject *in_stack_fffffffffffff120;
  QMakeProject *in_stack_fffffffffffff128;
  undefined6 in_stack_fffffffffffff130;
  undefined1 in_stack_fffffffffffff136;
  undefined1 in_stack_fffffffffffff137;
  QMakeEvaluator *in_stack_fffffffffffff138;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>,_QString_&>,_QLatin1String>,_QLatin1String>
  *in_stack_fffffffffffff148;
  undefined7 in_stack_fffffffffffff150;
  undefined1 in_stack_fffffffffffff157;
  undefined1 uVar9;
  char *in_stack_fffffffffffff158;
  char *pcVar10;
  byte local_e51;
  int local_da4;
  QString local_bd0;
  undefined1 local_bb1;
  const_iterator local_bb0;
  QFlagsStorageHelper<QDirListing::IteratorFlag,_4> local_ba4;
  undefined1 local_ba0 [24];
  undefined8 local_b88 [17];
  QLatin1String *local_b00;
  QString local_af0;
  undefined8 local_ad8;
  QString local_ad0 [2];
  undefined8 local_aa0;
  undefined8 local_a98;
  undefined8 local_a90;
  undefined8 local_a88;
  undefined8 local_a80;
  undefined8 local_a78;
  ProString *local_a70;
  iterator local_a68;
  iterator local_a60;
  QStringBuilder<const_ProString_&,_const_char_(&)[7]> local_a58;
  QString *local_a18;
  char local_a10;
  undefined1 local_a01 [59];
  char16_t local_9c6;
  QLatin1Char local_9c3 [3];
  char16_t local_9c0;
  QLatin1Char local_9bd [3];
  char16_t local_9ba;
  QStringBuilder<const_ProString_&,_const_char_(&)[6]> local_9b8;
  QString local_948;
  ProString *local_930;
  iterator local_928;
  iterator local_920 [11];
  QLatin1Char local_8c1 [25];
  undefined1 local_8a8 [31];
  QLatin1Char local_889 [97];
  QFileInfo local_828 [105];
  QLatin1Char local_7bf [4];
  QLatin1Char local_7bb;
  ushort local_7ba;
  undefined8 local_7b8;
  undefined8 local_7b0;
  undefined8 local_7a8;
  ProString *local_7a0;
  const_iterator local_798;
  const_iterator local_790;
  undefined8 local_788 [3];
  QLatin1Char local_76b;
  QChar local_76a;
  QString local_758 [2];
  undefined1 local_728 [352];
  QFileInfo local_5c8 [9];
  QLatin1Char local_5bf [4];
  QLatin1Char local_5bb;
  ushort local_5ba;
  undefined8 local_5b8;
  undefined8 local_5b0;
  undefined8 local_5a8;
  ProString *local_5a0;
  const_iterator local_598;
  const_iterator local_590;
  undefined8 local_588;
  QLatin1Char local_57b [76];
  QLatin1Char local_52f;
  ushort local_52e;
  QLatin1Char local_52b;
  QChar local_52a;
  QString local_528;
  const_iterator local_510 [31];
  undefined8 local_418;
  undefined8 local_410;
  undefined8 local_408;
  undefined8 local_3d0;
  undefined8 local_3c8;
  undefined8 local_3c0;
  undefined1 local_3b8 [24];
  undefined1 local_3a0 [246];
  QChar local_2aa [37];
  undefined8 local_260;
  undefined8 local_258;
  undefined8 local_250;
  QString *local_248;
  char local_240;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_260 = 0xaaaaaaaaaaaaaaaa;
  local_258 = 0xaaaaaaaaaaaaaaaa;
  local_250 = 0xaaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x2964f4);
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff120,
                 (char *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  QMakeProject::values
            (in_stack_fffffffffffff120,
             (ProKey *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  QChar::QChar<char,_true>(local_2aa,' ');
  ProStringList::join((ProStringList *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118)
                      ,(QChar)(char16_t)((ulong)in_stack_fffffffffffff128 >> 0x30));
  QString::operator=((QString *)in_stack_fffffffffffff120,
                     (QString *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  QString::~QString((QString *)0x29658d);
  ProKey::~ProKey((ProKey *)0x29659a);
  bVar1 = QString::isEmpty((QString *)0x2965a7);
  if (bVar1) {
    QString::QString((QString *)in_stack_fffffffffffff128,in_stack_fffffffffffff158);
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff120,
                   (char *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    QMakeEvaluator::first
              (in_stack_fffffffffffff138,
               (ProKey *)
               CONCAT17(in_stack_fffffffffffff137,
                        CONCAT16(in_stack_fffffffffffff136,in_stack_fffffffffffff130)));
    ::operator+((QString *)in_stack_fffffffffffff128,(ProString *)in_stack_fffffffffffff120);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QString,_ProString> *)
               CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    QString::operator=((QString *)in_stack_fffffffffffff120,
                       (QString *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    QString::~QString((QString *)0x296660);
    QStringBuilder<QString,_ProString>::~QStringBuilder
              ((QStringBuilder<QString,_ProString> *)in_stack_fffffffffffff120);
    ProString::~ProString((ProString *)0x29667a);
    ProKey::~ProKey((ProKey *)0x296687);
    QString::~QString((QString *)0x296694);
  }
  QString::QString((QString *)in_stack_fffffffffffff128,in_stack_fffffffffffff158);
  bVar2 = QString::endsWith((QString *)&local_260,(CaseSensitivity)local_3a0);
  local_e51 = 1;
  if ((bVar2 & 1) == 0) {
    QString::QString((QString *)in_stack_fffffffffffff128,in_stack_fffffffffffff158);
    local_e51 = QString::endsWith((QString *)&local_260,(CaseSensitivity)local_3b8);
    QString::~QString((QString *)0x29673e);
  }
  QString::~QString((QString *)0x29674b);
  if ((local_e51 & 1) != 0) {
    QString::chop((longlong)&local_260);
  }
  QString::operator=((QString *)(in_RDI + 0xf08),(QString *)&local_260);
  local_3d0 = 0xaaaaaaaaaaaaaaaa;
  local_3c8 = 0xaaaaaaaaaaaaaaaa;
  local_3c0 = 0xaaaaaaaaaaaaaaaa;
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff120,
                 (char *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  QMakeProject::values
            (in_stack_fffffffffffff120,
             (ProKey *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  ProStringList::ProStringList
            ((ProStringList *)in_stack_fffffffffffff120,
             (ProStringList *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  ProKey::~ProKey((ProKey *)0x296814);
  bVar1 = QList<ProString>::isEmpty((QList<ProString> *)0x296821);
  if (!bVar1) {
    local_418 = 0xaaaaaaaaaaaaaaaa;
    local_410 = 0xaaaaaaaaaaaaaaaa;
    local_408 = 0xaaaaaaaaaaaaaaaa;
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff120,
                   (char *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    QMakeProject::values
              (in_stack_fffffffffffff120,
               (ProKey *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff120,
                   (char *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    QMakeProject::values
              (in_stack_fffffffffffff120,
               (ProKey *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    ::operator+((ProStringList *)in_stack_fffffffffffff138,
                (ProStringList *)
                CONCAT17(in_stack_fffffffffffff137,
                         CONCAT16(in_stack_fffffffffffff136,in_stack_fffffffffffff130)));
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff120,
                   (char *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    QMakeProject::values
              (in_stack_fffffffffffff120,
               (ProKey *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    ::operator+((ProStringList *)in_stack_fffffffffffff138,
                (ProStringList *)
                CONCAT17(in_stack_fffffffffffff137,
                         CONCAT16(in_stack_fffffffffffff136,in_stack_fffffffffffff130)));
    ProKey::ProKey((ProKey *)in_stack_fffffffffffff120,
                   (char *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    QMakeProject::values
              (in_stack_fffffffffffff120,
               (ProKey *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    ::operator+((ProStringList *)in_stack_fffffffffffff138,
                (ProStringList *)
                CONCAT17(in_stack_fffffffffffff137,
                         CONCAT16(in_stack_fffffffffffff136,in_stack_fffffffffffff130)));
    ProKey::~ProKey((ProKey *)0x29699e);
    ProStringList::~ProStringList((ProStringList *)0x2969ab);
    ProKey::~ProKey((ProKey *)0x2969b8);
    ProStringList::~ProStringList((ProStringList *)0x2969c5);
    ProKey::~ProKey((ProKey *)0x2969d2);
    ProKey::~ProKey((ProKey *)0x2969df);
    bVar1 = false;
    local_510[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
    local_510[0] = QList<ProString>::constBegin((QList<ProString> *)in_stack_fffffffffffff120);
    while( true ) {
      o = QList<ProString>::constEnd((QList<ProString> *)in_stack_fffffffffffff120);
      bVar3 = QList<ProString>::const_iterator::operator!=(local_510,o);
      if (!bVar3) break;
      local_528.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_528.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      local_528.d.size = -0x5555555555555556;
      QList<ProString>::const_iterator::operator*(local_510);
      ProString::toQString
                ((ProString *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
      QLatin1Char::QLatin1Char(&local_52b,'\\');
      QChar::QChar<QLatin1Char,_true>
                ((QChar *)in_stack_fffffffffffff120,
                 (QLatin1Char)(char)((ulong)in_stack_fffffffffffff128 >> 0x38));
      QLatin1Char::QLatin1Char(&local_52f,'/');
      QChar::QChar<QLatin1Char,_true>
                ((QChar *)in_stack_fffffffffffff120,
                 (QLatin1Char)(char)((ulong)in_stack_fffffffffffff128 >> 0x38));
      QString::replace((QChar)(char16_t)&local_528,local_52a,(uint)local_52e);
      QLatin1String::QLatin1String
                ((QLatin1String *)
                 CONCAT17(in_stack_fffffffffffff137,
                          CONCAT16(in_stack_fffffffffffff136,in_stack_fffffffffffff130)),
                 (char *)in_stack_fffffffffffff128);
      uVar5 = QString::startsWith((QLatin1String *)&local_528,(CaseSensitivity)local_57b._59_8_);
      if ((uVar5 & 1) == 0) {
        QLatin1String::QLatin1String
                  ((QLatin1String *)
                   CONCAT17(in_stack_fffffffffffff137,
                            CONCAT16(in_stack_fffffffffffff136,in_stack_fffffffffffff130)),
                   (char *)in_stack_fffffffffffff128);
        uVar5 = QString::endsWith((QLatin1String *)&local_528,(CaseSensitivity)local_57b._43_8_);
        if ((uVar5 & 1) != 0) {
          qVar6 = QString::size(&local_528);
          QLatin1String::QLatin1String
                    ((QLatin1String *)
                     CONCAT17(in_stack_fffffffffffff137,
                              CONCAT16(in_stack_fffffffffffff136,in_stack_fffffffffffff130)),
                     (char *)in_stack_fffffffffffff128);
          latin1.m_size._7_1_ = in_stack_fffffffffffff157;
          latin1.m_size._0_7_ = in_stack_fffffffffffff150;
          latin1.m_data = in_stack_fffffffffffff158;
          QString::QString((QString *)
                           CONCAT17(in_stack_fffffffffffff137,
                                    CONCAT16(in_stack_fffffffffffff136,in_stack_fffffffffffff130)),
                           latin1);
          QString::replace((longlong)&local_528,qVar6 + -3,(QString *)0x3);
          QString::~QString((QString *)0x296bf6);
        }
        QLatin1Char::QLatin1Char(local_57b,'/');
        QChar::QChar<QLatin1Char,_true>
                  ((QChar *)in_stack_fffffffffffff120,
                   (QLatin1Char)(char)((ulong)in_stack_fffffffffffff128 >> 0x38));
        QString::lastIndexOf
                  ((QString *)in_stack_fffffffffffff120,
                   (QChar)(char16_t)((ulong)in_stack_fffffffffffff128 >> 0x30),
                   in_stack_fffffffffffff11c);
        QString::remove((longlong)&local_528,0);
        local_588 = 0xaaaaaaaaaaaaaaaa;
        QFileInfo::QFileInfo((QFileInfo *)&local_588);
        local_590.i = (ProString *)0xaaaaaaaaaaaaaaaa;
        local_590 = QList<ProString>::begin((QList<ProString> *)in_stack_fffffffffffff120);
        local_598.i = (ProString *)0xaaaaaaaaaaaaaaaa;
        local_598 = QList<ProString>::end((QList<ProString> *)in_stack_fffffffffffff120);
        while( true ) {
          local_5a0 = local_598.i;
          bVar3 = QList<ProString>::const_iterator::operator!=(&local_590,local_598);
          if (!bVar3) break;
          QList<ProString>::const_iterator::operator*(&local_590);
          local_5b8 = 0xaaaaaaaaaaaaaaaa;
          local_5b0 = 0xaaaaaaaaaaaaaaaa;
          local_5a8 = 0xaaaaaaaaaaaaaaaa;
          ProString::toQString
                    ((ProString *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
          QLatin1Char::QLatin1Char(&local_5bb,'/');
          QChar::QChar<QLatin1Char,_true>
                    ((QChar *)in_stack_fffffffffffff120,
                     (QLatin1Char)(char)((ulong)in_stack_fffffffffffff128 >> 0x38));
          uVar5 = QString::endsWith((QChar)(char16_t)&local_5b8,(uint)local_5ba);
          if ((uVar5 & 1) == 0) {
            QLatin1Char::QLatin1Char(local_5bf,'/');
            QChar::QChar<QLatin1Char,_true>
                      ((QChar *)in_stack_fffffffffffff120,
                       (QLatin1Char)(char)((ulong)in_stack_fffffffffffff128 >> 0x38));
            QString::operator+=((QString *)in_stack_fffffffffffff120,
                                (QChar)(char16_t)((ulong)in_stack_fffffffffffff128 >> 0x30));
          }
          QString::operator+=((QString *)in_stack_fffffffffffff120,
                              (QString *)
                              CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
          QFileInfo::QFileInfo(local_5c8,(QString *)&local_5b8);
          QFileInfo::operator=
                    ((QFileInfo *)in_stack_fffffffffffff120,
                     (QFileInfo *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
          QFileInfo::~QFileInfo(local_5c8);
          uVar5 = QFileInfo::exists();
          if ((uVar5 & 1) == 0) {
            local_da4 = 0;
          }
          else {
            local_da4 = 5;
          }
          QString::~QString((QString *)0x296e71);
          if (local_da4 != 0) break;
          QList<ProString>::const_iterator::operator++(&local_590);
        }
        uVar5 = QFileInfo::exists();
        if ((uVar5 & 1) != 0) {
          QFileInfo::fileName();
          ::operator+((QString *)in_stack_fffffffffffff128,(char (*) [2])in_stack_fffffffffffff120);
          QFileInfo::absolutePath();
          QDir::toNativeSeparators((QString *)local_728);
          ::operator+((QStringBuilder<QString,_const_char_(&)[2]> *)in_stack_fffffffffffff128,
                      (QString *)in_stack_fffffffffffff120);
          ::operator+((QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString> *)
                      in_stack_fffffffffffff128,(char (*) [2])in_stack_fffffffffffff120);
          ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>,_const_char_(&)[2]>
                       *)in_stack_fffffffffffff128,(QString *)in_stack_fffffffffffff120);
          ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>,_const_char_(&)[2]>,_QString_&>
                       *)in_stack_fffffffffffff128,(char (*) [4])in_stack_fffffffffffff120);
          ::operator+=((QString *)CONCAT17(in_stack_fffffffffffff157,in_stack_fffffffffffff150),
                       (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[4]>
                        *)in_stack_fffffffffffff148);
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[4]>
          ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[4]>
                             *)0x296faf);
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>,_const_char_(&)[2]>,_QString_&>
          ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>,_const_char_(&)[2]>,_QString_&>
                             *)0x296fbc);
          QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>,_const_char_(&)[2]>
          ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>,_const_char_(&)[2]>
                             *)0x296fc9);
          QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString>::~QStringBuilder
                    ((QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_QString> *)
                     in_stack_fffffffffffff120);
          QString::~QString((QString *)0x296fe3);
          QString::~QString((QString *)0x296ff0);
          QStringBuilder<QString,_const_char_(&)[2]>::~QStringBuilder
                    ((QStringBuilder<QString,_const_char_(&)[2]> *)0x296ffd);
          QString::~QString((QString *)0x29700a);
          if (!bVar1) {
            local_758[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_758[0].d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
            local_758[0].d.size = -0x5555555555555556;
            QString::QString((QString *)0x297052);
            QLatin1String::QLatin1String
                      ((QLatin1String *)
                       CONCAT17(in_stack_fffffffffffff137,
                                CONCAT16(in_stack_fffffffffffff136,in_stack_fffffffffffff130)),
                       (char *)in_stack_fffffffffffff128);
            s.m_size._6_1_ = in_stack_fffffffffffff136;
            s.m_size._0_6_ = in_stack_fffffffffffff130;
            s.m_size._7_1_ = in_stack_fffffffffffff137;
            s.m_data = (char *)in_stack_fffffffffffff138;
            bVar3 = QString::contains((QString *)
                                      CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118),
                                      s,CaseInsensitive);
            if (bVar3) {
              QLatin1Char::QLatin1Char(&local_76b,'d');
              QChar::QChar<QLatin1Char,_true>
                        ((QChar *)in_stack_fffffffffffff120,
                         (QLatin1Char)(char)((ulong)in_stack_fffffffffffff128 >> 0x38));
              QString::operator=(local_758,local_76a);
LAB_00297120:
              local_788[0] = 0xaaaaaaaaaaaaaaaa;
              QFileInfo::QFileInfo((QFileInfo *)local_788);
              local_790.i = (ProString *)0xaaaaaaaaaaaaaaaa;
              local_790 = QList<ProString>::begin((QList<ProString> *)in_stack_fffffffffffff120);
              local_798.i = (ProString *)0xaaaaaaaaaaaaaaaa;
              local_798 = QList<ProString>::end((QList<ProString> *)in_stack_fffffffffffff120);
              while( true ) {
                local_7a0 = local_798.i;
                bVar3 = QList<ProString>::const_iterator::operator!=(&local_790,local_798);
                if (!bVar3) break;
                QList<ProString>::const_iterator::operator*(&local_790);
                local_7b8 = 0xaaaaaaaaaaaaaaaa;
                local_7b0 = 0xaaaaaaaaaaaaaaaa;
                local_7a8 = 0xaaaaaaaaaaaaaaaa;
                ProString::toQString
                          ((ProString *)
                           CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
                QLatin1Char::QLatin1Char(&local_7bb,'/');
                QChar::QChar<QLatin1Char,_true>
                          ((QChar *)in_stack_fffffffffffff120,
                           (QLatin1Char)(char)((ulong)in_stack_fffffffffffff128 >> 0x38));
                uVar5 = QString::endsWith((QChar)(char16_t)&local_7b8,(uint)local_7ba);
                if ((uVar5 & 1) == 0) {
                  QLatin1Char::QLatin1Char(local_7bf,'/');
                  QChar::QChar<QLatin1Char,_true>
                            ((QChar *)in_stack_fffffffffffff120,
                             (QLatin1Char)(char)((ulong)in_stack_fffffffffffff128 >> 0x38));
                  QString::operator+=((QString *)in_stack_fffffffffffff120,
                                      (QChar)(char16_t)((ulong)in_stack_fffffffffffff128 >> 0x30));
                }
                QLatin1String::QLatin1String
                          ((QLatin1String *)
                           CONCAT17(in_stack_fffffffffffff137,
                                    CONCAT16(in_stack_fffffffffffff136,in_stack_fffffffffffff130)),
                           (char *)in_stack_fffffffffffff128);
                ::operator+((QLatin1String *)in_stack_fffffffffffff120,
                            (QString *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118)
                           );
                QLatin1String::QLatin1String
                          ((QLatin1String *)
                           CONCAT17(in_stack_fffffffffffff137,
                                    CONCAT16(in_stack_fffffffffffff136,in_stack_fffffffffffff130)),
                           (char *)in_stack_fffffffffffff128);
                ::operator+((QStringBuilder<QLatin1String,_QString_&> *)in_stack_fffffffffffff120,
                            (QLatin1String *)
                            CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
                ::operator+=((QString *)
                             CONCAT17(in_stack_fffffffffffff157,in_stack_fffffffffffff150),
                             (QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>
                              *)in_stack_fffffffffffff148);
                QFileInfo::QFileInfo(local_828,(QString *)&local_7b8);
                QFileInfo::operator=
                          ((QFileInfo *)in_stack_fffffffffffff120,
                           (QFileInfo *)
                           CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
                QFileInfo::~QFileInfo(local_828);
                uVar5 = QFileInfo::exists();
                if ((uVar5 & 1) == 0) {
                  local_da4 = 0;
                }
                else {
                  local_da4 = 7;
                }
                QString::~QString((QString *)0x2973a4);
                if (local_da4 != 0) break;
                QList<ProString>::const_iterator::operator++(&local_790);
              }
              uVar5 = QFileInfo::exists();
              if ((uVar5 & 1) != 0) {
                QLatin1String::QLatin1String
                          ((QLatin1String *)
                           CONCAT17(in_stack_fffffffffffff137,
                                    CONCAT16(in_stack_fffffffffffff136,in_stack_fffffffffffff130)),
                           (char *)in_stack_fffffffffffff128);
                ::operator+((QLatin1String *)in_stack_fffffffffffff120,
                            (QString *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118)
                           );
                QLatin1String::QLatin1String
                          ((QLatin1String *)
                           CONCAT17(in_stack_fffffffffffff137,
                                    CONCAT16(in_stack_fffffffffffff136,in_stack_fffffffffffff130)),
                           (char *)in_stack_fffffffffffff128);
                ::operator+((QStringBuilder<QLatin1String,_QString_&> *)in_stack_fffffffffffff120,
                            (QLatin1String *)
                            CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
                QLatin1Char::QLatin1Char(local_889,'|');
                ::operator+((QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>
                             *)in_stack_fffffffffffff120,
                            (QLatin1Char *)
                            CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
                QFileInfo::absolutePath();
                QDir::toNativeSeparators((QString *)local_8a8);
                ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>
                             *)in_stack_fffffffffffff128,(QString *)in_stack_fffffffffffff120);
                QLatin1Char::QLatin1Char(local_8c1,'|');
                ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>
                             *)in_stack_fffffffffffff128,(QLatin1Char *)in_stack_fffffffffffff120);
                ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>
                             *)in_stack_fffffffffffff128,(QString *)in_stack_fffffffffffff120);
                QLatin1String::QLatin1String
                          ((QLatin1String *)
                           CONCAT17(in_stack_fffffffffffff137,
                                    CONCAT16(in_stack_fffffffffffff136,in_stack_fffffffffffff130)),
                           (char *)in_stack_fffffffffffff128);
                ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>,_QString_&>
                             *)in_stack_fffffffffffff128,(QLatin1String *)in_stack_fffffffffffff120)
                ;
                QLatin1String::QLatin1String
                          ((QLatin1String *)
                           CONCAT17(in_stack_fffffffffffff137,
                                    CONCAT16(in_stack_fffffffffffff136,in_stack_fffffffffffff130)),
                           (char *)in_stack_fffffffffffff128);
                ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>,_QString_&>,_QLatin1String>
                             *)in_stack_fffffffffffff128,(QLatin1String *)in_stack_fffffffffffff120)
                ;
                ::operator+=((QString *)
                             CONCAT17(in_stack_fffffffffffff157,in_stack_fffffffffffff150),
                             in_stack_fffffffffffff148);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>,_QString_&>,_QLatin1String>,_QLatin1String>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>,_QString_&>,_QLatin1String>,_QLatin1String>
                                   *)0x297590);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>,_QString_&>,_QLatin1String>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>,_QString_&>,_QLatin1String>
                                   *)0x29759d);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>,_QString_&>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>,_QString_&>
                                   *)0x2975aa);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>
                                   *)0x2975b7);
                QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>
                ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>
                                   *)0x2975c4);
                QString::~QString((QString *)0x2975d1);
                QString::~QString((QString *)0x2975de);
                bVar1 = true;
              }
              QFileInfo::~QFileInfo((QFileInfo *)local_788);
            }
            else {
              QLatin1String::QLatin1String
                        ((QLatin1String *)
                         CONCAT17(in_stack_fffffffffffff137,
                                  CONCAT16(in_stack_fffffffffffff136,in_stack_fffffffffffff130)),
                         (char *)in_stack_fffffffffffff128);
              s_00.m_size._6_1_ = in_stack_fffffffffffff136;
              s_00.m_size._0_6_ = in_stack_fffffffffffff130;
              s_00.m_size._7_1_ = in_stack_fffffffffffff137;
              s_00.m_data = (char *)in_stack_fffffffffffff138;
              bVar3 = QString::contains((QString *)
                                        CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118
                                                ),s_00,CaseInsensitive);
              if (bVar3) goto LAB_00297120;
            }
            QString::~QString((QString *)0x297600);
          }
        }
        QFileInfo::~QFileInfo((QFileInfo *)&local_588);
      }
      QString::~QString((QString *)0x297625);
      QList<ProString>::const_iterator::operator++(local_510);
    }
    ProStringList::~ProStringList((ProStringList *)0x297655);
  }
  ProKey::ProKey((ProKey *)in_stack_fffffffffffff120,
                 (char *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  QMakeProject::values
            (in_stack_fffffffffffff120,
             (ProKey *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  ProKey::~ProKey((ProKey *)0x2976b3);
  local_920[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
  local_920[0] = QList<ProString>::begin((QList<ProString> *)in_stack_fffffffffffff120);
  local_928.i = (ProString *)0xaaaaaaaaaaaaaaaa;
  local_928 = QList<ProString>::end((QList<ProString> *)in_stack_fffffffffffff120);
  while( true ) {
    local_930 = local_928.i;
    bVar1 = QList<ProString>::iterator::operator!=(local_920,local_928);
    if (!bVar1) break;
    QList<ProString>::iterator::operator*(local_920);
    local_948.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_948.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_948.d.size = -0x5555555555555556;
    pcVar10 = *(char **)(in_RDI + 0xd8);
    local_9b8 = ::operator+((ProString *)in_stack_fffffffffffff120,
                            (char (*) [6])
                            CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    ProKey::ProKey<ProString_const&,char_const(&)[6]>
              ((ProKey *)in_stack_fffffffffffff120,
               (QStringBuilder<const_ProString_&,_const_char_(&)[6]> *)
               CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    QMakeEvaluator::first
              (in_stack_fffffffffffff138,
               (ProKey *)
               CONCAT17(in_stack_fffffffffffff137,
                        CONCAT16(in_stack_fffffffffffff136,in_stack_fffffffffffff130)));
    ProString::toQString((ProString *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118))
    ;
    ProString::~ProString((ProString *)0x297816);
    ProKey::~ProKey((ProKey *)0x297823);
    bVar1 = QString::isEmpty((QString *)0x297830);
    if (bVar1) {
      QString::operator=(&local_948,(QString *)&local_260);
    }
    local_9ba = (char16_t)
                QString::at((QString *)in_stack_fffffffffffff128,
                            (qsizetype)in_stack_fffffffffffff120);
    QLatin1Char::QLatin1Char(local_9bd,'/');
    QChar::QChar<QLatin1Char,_true>
              ((QChar *)in_stack_fffffffffffff120,
               (QLatin1Char)(char)((ulong)in_stack_fffffffffffff128 >> 0x38));
    bVar1 = ::operator==((QChar *)in_stack_fffffffffffff120,
                         (QChar *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    uVar9 = true;
    if (!bVar1) {
      local_9c0 = (char16_t)
                  QString::at((QString *)in_stack_fffffffffffff128,
                              (qsizetype)in_stack_fffffffffffff120);
      QLatin1Char::QLatin1Char(local_9c3,'\\');
      QChar::QChar<QLatin1Char,_true>
                ((QChar *)in_stack_fffffffffffff120,
                 (QLatin1Char)(char)((ulong)in_stack_fffffffffffff128 >> 0x38));
      bVar1 = ::operator==((QChar *)in_stack_fffffffffffff120,
                           (QChar *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
      uVar9 = true;
      if (!bVar1) {
        local_9c6 = (char16_t)
                    QString::at((QString *)in_stack_fffffffffffff128,
                                (qsizetype)in_stack_fffffffffffff120);
        QLatin1Char::QLatin1Char((QLatin1Char *)(local_a01 + 0x38),'%');
        QChar::QChar<QLatin1Char,_true>
                  ((QChar *)in_stack_fffffffffffff120,
                   (QLatin1Char)(char)((ulong)in_stack_fffffffffffff128 >> 0x38));
        uVar9 = ::operator==((QChar *)in_stack_fffffffffffff120,
                             (QChar *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118))
        ;
      }
    }
    if (((uVar9 ^ 0xff) & 1) != 0) {
      in_stack_fffffffffffff148 =
           (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QLatin1Char>,_QString>,_QLatin1Char>,_QString_&>,_QLatin1String>,_QLatin1String>
            *)local_a01;
      QLatin1Char::QLatin1Char((QLatin1Char *)in_stack_fffffffffffff148,'\\');
      QVar8 = ::operator+((QString *)in_stack_fffffffffffff128,
                          (QLatin1Char *)in_stack_fffffffffffff120);
      local_a18 = QVar8.a;
      local_a10 = (char)QVar8.b.ch;
      local_248 = local_a18;
      local_240 = local_a10;
      ::operator+((QStringBuilder<QString_&,_QLatin1Char> *)in_stack_fffffffffffff120,
                  (QString *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QStringBuilder<QString_&,_QLatin1Char>,_QString_&> *)
                 CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
      Option::fixPathToTargetOS
                ((QString *)in_stack_fffffffffffff138,(bool)in_stack_fffffffffffff137,
                 (bool)in_stack_fffffffffffff136);
      QString::operator=((QString *)in_stack_fffffffffffff120,
                         (QString *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
      QString::~QString((QString *)0x297a41);
      QString::~QString((QString *)0x297a4e);
    }
    in_stack_fffffffffffff138 = *(QMakeEvaluator **)(in_RDI + 0xd8);
    local_a58 = ::operator+((ProString *)in_stack_fffffffffffff120,
                            (char (*) [7])
                            CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    ProKey::ProKey<ProString_const&,char_const(&)[7]>
              ((ProKey *)in_stack_fffffffffffff120,
               (QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)
               CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    QMakeProject::values
              (in_stack_fffffffffffff120,
               (ProKey *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    ProKey::~ProKey((ProKey *)0x297ad1);
    local_a60.i = (ProString *)0xaaaaaaaaaaaaaaaa;
    local_a60 = QList<ProString>::begin((QList<ProString> *)in_stack_fffffffffffff120);
    local_a68.i = (ProString *)0xaaaaaaaaaaaaaaaa;
    local_a68 = QList<ProString>::end((QList<ProString> *)in_stack_fffffffffffff120);
    while( true ) {
      local_a70 = local_a68.i;
      bVar1 = QList<ProString>::iterator::operator!=(&local_a60,local_a68);
      if (!bVar1) break;
      QList<ProString>::iterator::operator*(&local_a60);
      local_a88 = 0xaaaaaaaaaaaaaaaa;
      local_a80 = 0xaaaaaaaaaaaaaaaa;
      local_a78 = 0xaaaaaaaaaaaaaaaa;
      QString::QString((QString *)in_stack_fffffffffffff120,
                       (QString *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
      local_aa0 = 0xaaaaaaaaaaaaaaaa;
      local_a98 = 0xaaaaaaaaaaaaaaaa;
      local_a90 = 0xaaaaaaaaaaaaaaaa;
      ProString::toQString
                ((ProString *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
      Option::normalizePath
                ((QString *)in_stack_fffffffffffff138,(bool)in_stack_fffffffffffff137,
                 (bool)in_stack_fffffffffffff136);
      QString::~QString((QString *)0x297c28);
      local_ad0[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_ad0[0].d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      local_ad0[0].d.size = -0x5555555555555556;
      QString::QString((QString *)0x297c62);
      local_ad8 = 0xaaaaaaaaaaaaaaaa;
      QFileInfo::QFileInfo((QFileInfo *)&local_ad8,(QString *)&local_aa0);
      local_af0.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_af0.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      local_af0.d.size = -0x5555555555555556;
      QString::QString((QString *)0x297cc0);
      uVar5 = QFileInfo::isDir();
      if ((uVar5 & 1) == 0) {
        QFileInfo::fileName();
        QString::operator=((QString *)in_stack_fffffffffffff120,
                           (QString *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118))
        ;
        QString::~QString((QString *)0x297dd7);
        QFileInfo::absolutePath();
        QString::operator=((QString *)in_stack_fffffffffffff120,
                           (QString *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118))
        ;
        QString::~QString((QString *)0x297e0e);
      }
      else {
        QLatin1String::QLatin1String
                  ((QLatin1String *)
                   CONCAT17(in_stack_fffffffffffff137,
                            CONCAT16(in_stack_fffffffffffff136,in_stack_fffffffffffff130)),
                   (char *)in_stack_fffffffffffff128);
        QString::operator=(local_ad0,local_b00);
        QFileInfo::fileName();
        ::operator+((char (*) [2])in_stack_fffffffffffff128,(QString *)in_stack_fffffffffffff120);
        ::operator+=((QString *)CONCAT17(uVar9,in_stack_fffffffffffff150),
                     (QStringBuilder<const_char_(&)[2],_QString> *)in_stack_fffffffffffff148);
        QStringBuilder<const_char_(&)[2],_QString>::~QStringBuilder
                  ((QStringBuilder<const_char_(&)[2],_QString> *)0x297d5a);
        QString::~QString((QString *)0x297d67);
        QFileInfo::absoluteFilePath();
        QString::operator=((QString *)in_stack_fffffffffffff120,
                           (QString *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118))
        ;
        QString::~QString((QString *)0x297d9e);
      }
      qVar6 = QString::size(&local_af0);
      local_b88[0] = 0xaaaaaaaaaaaaaaaa;
      QString::QString((QString *)in_stack_fffffffffffff120,
                       (QString *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
      args._M_array._6_1_ = in_stack_fffffffffffff136;
      args._M_array._0_6_ = in_stack_fffffffffffff130;
      args._M_array._7_1_ = in_stack_fffffffffffff137;
      args._M_len = (size_type)in_stack_fffffffffffff138;
      QList<QString>::QList((QList<QString> *)in_stack_fffffffffffff128,args);
      local_ba4.super_QFlagsStorage<QDirListing::IteratorFlag>.i =
           (QFlagsStorage<QDirListing::IteratorFlag>)
           operator|((enum_type)((ulong)in_stack_fffffffffffff120 >> 0x20),
                     (enum_type)in_stack_fffffffffffff120);
      QVar4 = QFlags<QDirListing::IteratorFlag>::operator|
                        ((QFlags<QDirListing::IteratorFlag> *)in_stack_fffffffffffff120,
                         in_stack_fffffffffffff11c);
      QDirListing::QDirListing
                ((QDirListing *)local_b88,(QString *)&local_af0,(QList_conflict2 *)local_ba0,
                 (QFlags_conflict *)
                 (ulong)(uint)QVar4.super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
                              super_QFlagsStorage<QDirListing::IteratorFlag>.i);
      QList<QString>::~QList((QList<QString> *)0x297edf);
      in_stack_fffffffffffff128 = (QMakeProject *)&stack0xffffffffffffffe0;
      in_stack_fffffffffffff130 = SUB86(&stack0xfffffffffffffff8,0);
      in_stack_fffffffffffff136 = (undefined1)((ulong)&stack0xfffffffffffffff8 >> 0x30);
      in_stack_fffffffffffff137 = (undefined1)((ulong)&stack0xfffffffffffffff8 >> 0x38);
      do {
        in_stack_fffffffffffff120 =
             (QMakeProject *)
             (CONCAT17(in_stack_fffffffffffff137,
                       CONCAT16(in_stack_fffffffffffff136,in_stack_fffffffffffff130)) + -0x18);
        QString::~QString((QString *)0x297f08);
        in_stack_fffffffffffff130 = SUB86(in_stack_fffffffffffff120,0);
        in_stack_fffffffffffff136 = (undefined1)((ulong)in_stack_fffffffffffff120 >> 0x30);
        in_stack_fffffffffffff137 = (undefined1)((ulong)in_stack_fffffffffffff120 >> 0x38);
      } while (in_stack_fffffffffffff120 != in_stack_fffffffffffff128);
      local_bb0.dirEntry.dirListPtr = (DirEntry)(QDirListingPrivate *)0xaaaaaaaaaaaaaaaa;
      local_bb0.dirEntry.dirListPtr = (DirEntry)QDirListing::begin();
      local_bb1 = 0xaa;
      QDirListing::end((QDirListing *)local_b88);
      while (bVar1 = ::operator!=(&local_bb0), bVar1) {
        QDirListing::const_iterator::operator*(&local_bb0);
        local_bd0.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_bd0.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        local_bd0.d.size = -0x5555555555555556;
        QDirListing::DirEntry::absolutePath();
        Option::fixPathToTargetOS
                  ((QString *)in_stack_fffffffffffff138,(bool)in_stack_fffffffffffff137,
                   (bool)in_stack_fffffffffffff136);
        QString::~QString((QString *)0x298024);
        qVar7 = QString::size(&local_bd0);
        QDirListing::DirEntry::fileName();
        ::operator+((QString *)in_stack_fffffffffffff128,(char (*) [2])in_stack_fffffffffffff120);
        ::operator+((QStringBuilder<QString,_const_char_(&)[2]> *)in_stack_fffffffffffff128,
                    (QString *)in_stack_fffffffffffff120);
        ::operator+((QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&> *)
                    in_stack_fffffffffffff128,(char (*) [2])in_stack_fffffffffffff120);
        ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>
                     *)in_stack_fffffffffffff128,(QString *)in_stack_fffffffffffff120);
        if ((int)qVar7 == (int)qVar6) {
          QLatin1String::QLatin1String
                    ((QLatin1String *)
                     CONCAT17(in_stack_fffffffffffff137,
                              CONCAT16(in_stack_fffffffffffff136,in_stack_fffffffffffff130)),
                     (char *)in_stack_fffffffffffff128);
          latin1_00.m_size._7_1_ = uVar9;
          latin1_00.m_size._0_7_ = in_stack_fffffffffffff150;
          latin1_00.m_data = pcVar10;
          QString::QString((QString *)
                           CONCAT17(in_stack_fffffffffffff137,
                                    CONCAT16(in_stack_fffffffffffff136,in_stack_fffffffffffff130)),
                           latin1_00);
        }
        else {
          QString::right((QString *)in_stack_fffffffffffff138,
                         CONCAT17(in_stack_fffffffffffff137,
                                  CONCAT16(in_stack_fffffffffffff136,in_stack_fffffffffffff130)));
        }
        ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                     *)in_stack_fffffffffffff128,(QString *)in_stack_fffffffffffff120);
        ::operator+((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                     *)in_stack_fffffffffffff128,(char (*) [4])in_stack_fffffffffffff120);
        ::operator+=((QString *)CONCAT17(uVar9,in_stack_fffffffffffff150),
                     (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>,_const_char_(&)[4]>
                      *)in_stack_fffffffffffff148);
        QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>,_const_char_(&)[4]>
        ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>,_const_char_(&)[4]>
                           *)0x29818a);
        QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
        ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>,_QString>
                           *)in_stack_fffffffffffff120);
        QString::~QString((QString *)0x2981a4);
        QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
        ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>,_QString_&>
                           *)0x2981b1);
        QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>
        ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>,_const_char_(&)[2]>
                           *)0x2981be);
        QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&>::~QStringBuilder
                  ((QStringBuilder<QStringBuilder<QString,_const_char_(&)[2]>,_const_QString_&> *)
                   0x2981cb);
        QStringBuilder<QString,_const_char_(&)[2]>::~QStringBuilder
                  ((QStringBuilder<QString,_const_char_(&)[2]> *)0x2981d8);
        QString::~QString((QString *)0x2981e5);
        QString::~QString((QString *)0x2981f2);
        QDirListing::const_iterator::operator++
                  ((const_iterator *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
      }
      QDirListing::~QDirListing((QDirListing *)local_b88);
      QString::~QString((QString *)0x29821e);
      QFileInfo::~QFileInfo((QFileInfo *)&local_ad8);
      QString::~QString((QString *)0x298238);
      QString::~QString((QString *)0x298245);
      QString::~QString((QString *)0x298252);
      QList<ProString>::iterator::operator++(&local_a60);
    }
    QString::~QString((QString *)0x298271);
    QList<ProString>::iterator::operator++(local_920);
  }
  ProStringList::~ProStringList((ProStringList *)0x298290);
  QString::~QString((QString *)0x29829d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VcprojGenerator::initDeploymentTool()
{
    VCConfiguration &conf = vcProject.Configuration;
    QString targetPath;
    targetPath = project->values("deploy.path").join(' ');
    if (targetPath.isEmpty())
        targetPath = QString("%CSIDL_PROGRAM_FILES%\\") + project->first("TARGET");
    if (targetPath.endsWith("/") || targetPath.endsWith("\\"))
        targetPath.chop(1);
    conf.deployment.RemoteDirectory = targetPath;
    const ProStringList dllPaths = project->values("QMAKE_DLL_PATHS");
    // Only deploy Qt libs for shared build
    if (!dllPaths.isEmpty()) {
        // FIXME: This code should actually resolve the libraries from all Qt modules.
        ProStringList arg = project->values("LIBS") + project->values("LIBS_PRIVATE")
                + project->values("QMAKE_LIBS") + project->values("QMAKE_LIBS_PRIVATE");
        bool qpaPluginDeployed = false;
        for (ProStringList::ConstIterator it = arg.constBegin(); it != arg.constEnd(); ++it) {
            QString dllName = (*it).toQString();
            dllName.replace(QLatin1Char('\\'), QLatin1Char('/'));
            // LIBPATH isn't relevant for deployment
            if (dllName.startsWith(QLatin1String("/LIBPATH:")))
                continue;
            // We want to deploy .dlls not .libs
            if (dllName.endsWith(QLatin1String(".lib")))
                dllName.replace(dllName.size() - 3, 3, QLatin1String("dll"));
            // Use only the file name and check in Qt's install path and LIBPATHs to check for existence
            dllName.remove(0, dllName.lastIndexOf(QLatin1Char('/')) + 1);
            QFileInfo info;
            for (const ProString &dllPath : dllPaths) {
                QString absoluteDllFilePath = dllPath.toQString();
                if (!absoluteDllFilePath.endsWith(QLatin1Char('/')))
                    absoluteDllFilePath += QLatin1Char('/');
                absoluteDllFilePath += dllName;
                info = QFileInfo(absoluteDllFilePath);
                if (info.exists())
                    break;
            }

            if (!info.exists())
                continue;

            conf.deployment.AdditionalFiles += info.fileName()
                    + "|" + QDir::toNativeSeparators(info.absolutePath())
                    + "|" + targetPath
                    + "|0;";
            if (!qpaPluginDeployed) {
                QString debugInfix;
                bool foundGuid = dllName.contains(QLatin1String("Guid"));
                if (foundGuid)
                    debugInfix = QLatin1Char('d');

                if (foundGuid || dllName.contains(QLatin1String("Gui"))) {
                    QFileInfo info2;
                    for (const ProString &dllPath : dllPaths) {
                        QString absoluteDllFilePath = dllPath.toQString();
                        if (!absoluteDllFilePath.endsWith(QLatin1Char('/')))
                            absoluteDllFilePath += QLatin1Char('/');
                        absoluteDllFilePath += QLatin1String("../plugins/platforms/qwindows")
                                + debugInfix + QLatin1String(".dll");
                        info2 = QFileInfo(absoluteDllFilePath);
                        if (info2.exists())
                            break;
                    }
                    if (info2.exists()) {
                        conf.deployment.AdditionalFiles += QLatin1String("qwindows") + debugInfix + QLatin1String(".dll")
                                                    + QLatin1Char('|') + QDir::toNativeSeparators(info2.absolutePath())
                                                    + QLatin1Char('|') + targetPath + QLatin1String("\\platforms")
                                                    + QLatin1String("|0;");
                        qpaPluginDeployed = true;
                    }
                }
            }
        }
    }

    for (const ProString &item : project->values("INSTALLS")) {
        // get item.path
        QString devicePath = project->first(ProKey(item + ".path")).toQString();
        if (devicePath.isEmpty())
            devicePath = targetPath;
        // check if item.path is relative (! either /,\ or %)
        if (!(devicePath.at(0) == QLatin1Char('/')
            || devicePath.at(0) == QLatin1Char('\\')
            || devicePath.at(0) == QLatin1Char('%'))) {
            // create output path
            devicePath = Option::fixPathToTargetOS(targetPath + QLatin1Char('\\') + devicePath);
        }
        // foreach d in item.files
        for (const ProString &src : project->values(ProKey(item + ".files"))) {
            QString itemDevicePath = devicePath;
            QString source = Option::normalizePath(src.toQString());
            QString nameFilter;
            QFileInfo info(source);
            QString searchPath;
            if (info.isDir()) {
                nameFilter = QLatin1String("*");
                itemDevicePath += "\\" + info.fileName();
                searchPath = info.absoluteFilePath();
            } else {
                nameFilter = info.fileName();
                searchPath = info.absolutePath();
            }

            int pathSize = searchPath.size();
            using F = QDirListing::IteratorFlag;
            QDirListing dirList(searchPath, QStringList{nameFilter}, F::FilesOnly | F::ResolveSymlinks | F::Recursive);
            // foreach dirIterator-entry in d
            for (const auto &dirEntry : dirList) {
                const QString absoluteItemPath = Option::fixPathToTargetOS(dirEntry.absolutePath());
                // Identify if it is just another subdir
                int diffSize = absoluteItemPath.size() - pathSize;
                // write out rules
                conf.deployment.AdditionalFiles += dirEntry.fileName()
                        + "|" + absoluteItemPath
                        + "|" + itemDevicePath + (diffSize ? (absoluteItemPath.right(diffSize)) : QLatin1String(""))
                        + "|0;";
            }
        }
    }
}